

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O0

QSize __thiscall QDialog::minimumSizeHint(QDialog *this)

{
  int iVar1;
  QDialogPrivate *pQVar2;
  int *piVar3;
  long in_FS_OFFSET;
  QDialogPrivate *d;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int local_40;
  QSize local_3c;
  int local_34;
  undefined8 local_30;
  int local_28;
  QSize local_24;
  int local_1c;
  QSize local_18;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QDialog *)0x745b1a);
  if (pQVar2->extension == (QWidget *)0x0) {
    local_10 = QWidget::minimumSizeHint
                         ((QWidget *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  }
  else if (pQVar2->orientation == Horizontal) {
    local_18 = QWidget::minimumSizeHint
                         ((QWidget *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    iVar1 = QSize::width((QSize *)0x745b5d);
    local_24 = QWidget::minimumSizeHint((QWidget *)CONCAT44(iVar1,in_stack_ffffffffffffff90));
    local_1c = QSize::height((QSize *)0x745b7a);
    local_30 = (**(code **)(*(long *)pQVar2->extension + 0x78))();
    local_28 = QSize::height((QSize *)0x745b9f);
    qMax<int>(&local_1c,&local_28);
    QSize::QSize((QSize *)CONCAT44(iVar1,in_stack_ffffffffffffff90),
                 (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)in_stack_ffffffffffffff88);
  }
  else {
    local_3c = QWidget::minimumSizeHint
                         ((QWidget *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    local_34 = QSize::width((QSize *)0x745be0);
    (**(code **)(*(long *)pQVar2->extension + 0x78))();
    local_40 = QSize::width((QSize *)0x745c05);
    piVar3 = qMax<int>(&local_34,&local_40);
    iVar1 = *piVar3;
    QWidget::minimumSizeHint((QWidget *)CONCAT44(in_stack_ffffffffffffff94,iVar1));
    QSize::height((QSize *)0x745c37);
    QSize::QSize((QSize *)CONCAT44(in_stack_ffffffffffffff94,iVar1),
                 (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)in_stack_ffffffffffffff88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

QSize QDialog::minimumSizeHint() const
{
    Q_D(const QDialog);
    if (d->extension) {
        if (d->orientation == Qt::Horizontal)
            return QSize(QWidget::minimumSizeHint().width(),
                        qMax(QWidget::minimumSizeHint().height(), d->extension->minimumSizeHint().height()));
        else
            return QSize(qMax(QWidget::minimumSizeHint().width(), d->extension->minimumSizeHint().width()),
                        QWidget::minimumSizeHint().height());
    }

    return QWidget::minimumSizeHint();
}